

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

HasSizeMatcher * Catch::Matchers::SizeIs(HasSizeMatcher *__return_storage_ptr__,size_t sz)

{
  size_t sz_local;
  
  HasSizeMatcher::HasSizeMatcher(__return_storage_ptr__,sz);
  return __return_storage_ptr__;
}

Assistant:

HasSizeMatcher SizeIs(std::size_t sz) {
        return HasSizeMatcher{ sz };
    }